

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

char * get_action_name(int action)

{
  char *pcStack_10;
  int action_local;
  
  if (action == 0) {
    pcStack_10 = "released";
  }
  else if (action == 1) {
    pcStack_10 = "pressed";
  }
  else if (action == 2) {
    pcStack_10 = "repeated";
  }
  else {
    pcStack_10 = "caused unknown action";
  }
  return pcStack_10;
}

Assistant:

static const char* get_action_name(int action)
{
    switch (action)
    {
        case GLFW_PRESS:
            return "pressed";
        case GLFW_RELEASE:
            return "released";
        case GLFW_REPEAT:
            return "repeated";
    }

    return "caused unknown action";
}